

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

int __thiscall
Lib::List<Inferences::ALASCA::SuperpositionConf::Rhs>::remove
          (List<Inferences::ALASCA::SuperpositionConf::Rhs> *this,char *__filename)

{
  Clause *pCVar1;
  Clause *pCVar2;
  Clause *pCVar3;
  Rhs local_70;
  
  if (__filename == (char *)0x0) {
    __filename = (char *)0x0;
  }
  else {
    Inferences::ALASCA::SuperpositionConf::Rhs::Rhs(&local_70,(Rhs *)__filename);
    pCVar1 = *(Clause **)(__filename + 0x48);
    if ((((local_70.super_SelectedLiteral.cl)->super_Unit)._number ==
         (((this->_head).super_SelectedLiteral.cl)->super_Unit)._number) &&
       (local_70.super_SelectedLiteral.litIdx == (this->_head).super_SelectedLiteral.litIdx)) {
LAB_002fe213:
      operator_delete(__filename,0x50);
      __filename = (char *)pCVar1;
    }
    else if (pCVar1 != (Clause *)0x0) {
      pCVar2 = (Clause *)__filename;
      pCVar3 = pCVar1;
      do {
        Inferences::ALASCA::SuperpositionConf::Rhs::Rhs(&local_70,(Rhs *)pCVar3);
        pCVar1 = *(Clause **)&pCVar3->_refCnt;
        if ((((local_70.super_SelectedLiteral.cl)->super_Unit)._number ==
             (((this->_head).super_SelectedLiteral.cl)->super_Unit)._number) &&
           (local_70.super_SelectedLiteral.litIdx == (this->_head).super_SelectedLiteral.litIdx)) {
          (((Rhs *)((long)pCVar2 + 0x48))->super_SelectedLiteral).cl = pCVar1;
          pCVar1 = (Clause *)__filename;
          __filename = (char *)pCVar3;
          goto LAB_002fe213;
        }
        pCVar2 = pCVar3;
        pCVar3 = pCVar1;
      } while (pCVar1 != (Clause *)0x0);
    }
  }
  return (int)__filename;
}

Assistant:

static bool isEmpty (const List* l)
  {
    return l == 0;
  }